

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O2

void RigidBodyDynamics::Math::SparseSolveLTx(Model *model,MatrixNd *L,VectorNd *x)

{
  uint uVar1;
  double *pdVar2;
  double *pdVar3;
  long lVar4;
  pointer puVar5;
  ulong uVar6;
  ulong uVar8;
  ulong uVar7;
  
  pdVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  pdVar3 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  lVar4 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  puVar5 = (model->lambda_q).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  uVar7 = (ulong)model->qdot_size;
  while (uVar6 = uVar7 - 1, uVar7 != 0) {
    pdVar2[uVar6] = pdVar2[uVar6] / pdVar3[uVar6 + lVar4 * uVar6];
    uVar8 = uVar7;
    while( true ) {
      uVar1 = puVar5[uVar8 & 0xffffffff];
      uVar8 = (ulong)uVar1;
      uVar7 = uVar6;
      if (uVar1 == 0) break;
      uVar7 = (ulong)(uVar1 - 1);
      pdVar2[uVar7] = pdVar2[uVar7] - pdVar3[uVar6 + lVar4 * uVar7] * pdVar2[uVar6];
    }
  }
  return;
}

Assistant:

RBDL_DLLAPI void SparseSolveLTx (Model &model, Math::MatrixNd &L, Math::VectorNd &x) {
  for (unsigned int i = model.qdot_size; i > 0; i--) {
    x[i - 1] = x[i - 1] / L(i - 1,i - 1);
    unsigned int j = model.lambda_q[i];
    while (j != 0) {
      x[j - 1] = x[j - 1] - L(i - 1,j - 1) * x[i - 1];
      j = model.lambda_q[j];
    }
  }
}